

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::dualImpliedFreeGetRhsAndRowType
          (HPresolve *this,HighsInt row,double *rhs,RowType *rowType,bool relaxRowDualBounds)

{
  double dVar1;
  reference pvVar2;
  undefined4 *in_RCX;
  value_type *in_RDX;
  int in_ESI;
  long *in_RDI;
  byte in_R8B;
  double in_stack_000000e0;
  HighsInt in_stack_000000ec;
  HPresolve *in_stack_000000f0;
  
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),(long)in_ESI);
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),(long)in_ESI);
  if ((dVar1 != *pvVar2) || (NAN(dVar1) || NAN(*pvVar2))) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),(long)in_ESI);
    if (((*pvVar2 == INFINITY) && (!NAN(*pvVar2))) ||
       (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x47),(long)in_ESI)
       , *(double *)(in_RDI[1] + 0x120) < *pvVar2)) {
      *in_RCX = 0;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),(long)in_ESI);
      *in_RDX = *pvVar2;
      if ((in_R8B & 1) != 0) {
        changeRowDualLower(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
      }
    }
    else {
      *in_RCX = 1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),(long)in_ESI);
      *in_RDX = *pvVar2;
      if ((in_R8B & 1) != 0) {
        changeRowDualUpper(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
      }
    }
  }
  else {
    *in_RCX = 2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),(long)in_ESI);
    *in_RDX = *pvVar2;
  }
  return;
}

Assistant:

void HPresolve::dualImpliedFreeGetRhsAndRowType(
    HighsInt row, double& rhs, HighsPostsolveStack::RowType& rowType,
    bool relaxRowDualBounds) {
  assert(isDualImpliedFree(row));
  if (model->row_lower_[row] == model->row_upper_[row]) {
    rowType = HighsPostsolveStack::RowType::kEq;
    rhs = model->row_upper_[row];
  } else if (model->row_upper_[row] != kHighsInf &&
             implRowDualUpper[row] <= options->dual_feasibility_tolerance) {
    rowType = HighsPostsolveStack::RowType::kLeq;
    rhs = model->row_upper_[row];
    if (relaxRowDualBounds) changeRowDualUpper(row, kHighsInf);
  } else {
    rowType = HighsPostsolveStack::RowType::kGeq;
    rhs = model->row_lower_[row];
    if (relaxRowDualBounds) changeRowDualLower(row, -kHighsInf);
  }
}